

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ArrayJoinPromiseNode<int>::getNoError
          (ArrayJoinPromiseNode<int> *this,ExceptionOrValue *output)

{
  size_t sVar1;
  ExceptionOr<int> *pEVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int *piVar5;
  long lVar6;
  ExceptionOr<kj::Array<int>_> local_1c8;
  
  local_1c8.value.ptr.field_1.value.ptr =
       (int *)HeapArrayDisposer::allocateImpl
                        (4,0,(this->resultParts).size_,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
  sVar1 = (this->resultParts).size_;
  piVar5 = local_1c8.value.ptr.field_1.value.ptr;
  if (sVar1 != 0) {
    pEVar2 = (this->resultParts).ptr;
    lVar6 = 0;
    do {
      *piVar5 = *(int *)((long)&(pEVar2->value).ptr.field_1 + lVar6);
      piVar5 = piVar5 + 1;
      lVar6 = lVar6 + 0x1a0;
    } while (sVar1 * 0x1a0 - lVar6 != 0);
  }
  local_1c8.value.ptr.field_1.value.size_ =
       (long)piVar5 - (long)local_1c8.value.ptr.field_1.value.ptr >> 2;
  local_1c8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1c8.value.ptr.isSet = true;
  local_1c8.value.ptr.field_1.value.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  ExceptionOr<kj::Array<int>_>::operator=((ExceptionOr<kj::Array<int>_> *)output,&local_1c8);
  uVar4 = local_1c8.value.ptr.field_1.value.size_;
  uVar3 = local_1c8.value.ptr.field_1.value.ptr;
  if ((local_1c8.value.ptr.isSet == true) && (local_1c8.value.ptr.field_1.value.ptr != (int *)0x0))
  {
    local_1c8.value.ptr.field_1.value.ptr = (int *)0x0;
    local_1c8.value.ptr.field_1.value.size_ = 0;
    (**(local_1c8.value.ptr.field_1.value.disposer)->_vptr_ArrayDisposer)
              (local_1c8.value.ptr.field_1.value.disposer,uVar3,4,uVar4,uVar4,0);
  }
  if (local_1c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getNoError(ExceptionOrValue& output) noexcept override {
    auto builder = heapArrayBuilder<T>(resultParts.size());
    for (auto& part: resultParts) {
      KJ_IASSERT(part.value != kj::none,
                 "Bug in KJ promise framework:  Promise result had neither value no exception.");
      builder.add(kj::mv(*_::readMaybe(part.value)));
    }
    output.as<Array<T>>() = builder.finish();
  }